

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerMask::DoEffect(APowerMask *this)

{
  player_t *ppVar1;
  AActor *ent;
  FSoundID local_14;
  
  ppVar1 = ((this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner.field_0.p)->player;
  if (ppVar1 != (player_t *)0x0) {
    APlayerPawn::ResetAirSupply(ppVar1->mo,true);
  }
  if (((byte)level.time & 0x3f) != 0) {
    return;
  }
  ent = (this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner.field_0.p;
  if (ent != (AActor *)0x0) {
    if ((*(byte *)((long)&(ent->super_DThinker).super_DObject + 0x20) & 0x20) == 0)
    goto LAB_004a1fab;
    (this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner.field_0.p = (AActor *)0x0;
  }
  ent = (AActor *)0x0;
LAB_004a1fab:
  S_FindSound("misc/mask");
  S_Sound(ent,0,&local_14,1.0,3.0);
  return;
}

Assistant:

void APowerMask::DoEffect ()
{
	Super::DoEffect ();
	if (!(level.time & 0x3f))
	{
		S_Sound (Owner, CHAN_AUTO, "misc/mask", 1, ATTN_STATIC);
	}
}